

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sec.c
# Opt level: O1

_Bool duckdb_je_sec_init(tsdn_t *tsdn,sec_t *sec,base_t *base,pai_t *fallback,sec_opts_t *opts)

{
  ulong uVar1;
  undefined8 *puVar2;
  sec_bin_t *psVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  sec_shard_t *mutex;
  byte bVar8;
  uint uVar9;
  long lVar10;
  sec_shard_t *psVar11;
  int iVar12;
  sec_shard_t *shard;
  _Bool _Var13;
  
  uVar7 = opts->max_alloc & 0xfffffffffffff000;
  if (uVar7 < 0x7000000000000001) {
    uVar1 = uVar7 - 1;
    lVar10 = 0x3f;
    if (uVar1 != 0) {
      for (; uVar1 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    uVar9 = (uint)lVar10 ^ 0x3f;
    iVar12 = 0x32 - uVar9;
    if (0x32 < uVar9) {
      iVar12 = 0;
    }
    bVar8 = 0xc;
    if (0x4000 < uVar7) {
      bVar8 = (char)iVar12 + 0xb;
    }
    uVar9 = ((uint)(uVar1 >> (bVar8 & 0x3f)) & 3) + iVar12 * 4 + 1;
  }
  else {
    uVar9 = 200;
  }
  mutex = (sec_shard_t *)
          duckdb_je_base_alloc(tsdn,base,((ulong)uVar9 * 0x18 + 0x90) * opts->nshards,0x40);
  _Var13 = true;
  if (mutex != (sec_shard_t *)0x0) {
    sec->shards = mutex;
    _Var13 = opts->nshards != 0;
    if (_Var13) {
      psVar11 = mutex + opts->nshards;
      uVar7 = 0;
      do {
        _Var13 = duckdb_je_malloc_mutex_init
                           (&mutex->mtx,"sec_shard",WITNESS_RANK_SEC_SHARD,
                            malloc_mutex_rank_exclusive);
        if (!_Var13) {
          mutex->enabled = true;
          mutex->bins = (sec_bin_t *)psVar11;
          lVar10 = 0;
          do {
            psVar3 = mutex->bins;
            (&psVar3->being_batch_filled)[lVar10] = false;
            puVar2 = (undefined8 *)((long)&psVar3->bytes_cur + lVar10);
            *puVar2 = 0;
            puVar2[1] = 0;
            lVar10 = lVar10 + 0x18;
          } while ((ulong)uVar9 * 0x18 - lVar10 != 0);
          mutex->bytes_cur = 0;
          mutex->to_flush_next = 0;
          psVar11 = (sec_shard_t *)((long)&(psVar11->mtx).field_0 + lVar10);
        }
        if (_Var13) {
          return true;
        }
        mutex = mutex + 1;
        uVar7 = uVar7 + 1;
        _Var13 = uVar7 < opts->nshards;
      } while (_Var13);
    }
    sec->fallback = fallback;
    sVar4 = opts->max_alloc;
    sVar5 = opts->max_bytes;
    sVar6 = opts->bytes_after_flush;
    (sec->opts).nshards = opts->nshards;
    (sec->opts).max_alloc = sVar4;
    (sec->opts).max_bytes = sVar5;
    (sec->opts).bytes_after_flush = sVar6;
    (sec->opts).batch_fill_extra = opts->batch_fill_extra;
    sec->npsizes = uVar9;
    (sec->pai).alloc = sec_alloc;
    (sec->pai).alloc_batch = duckdb_je_pai_alloc_batch_default;
    (sec->pai).expand = sec_expand;
    (sec->pai).shrink = sec_shrink;
    (sec->pai).dalloc = sec_dalloc;
    (sec->pai).dalloc_batch = duckdb_je_pai_dalloc_batch_default;
  }
  return _Var13;
}

Assistant:

bool
sec_init(tsdn_t *tsdn, sec_t *sec, base_t *base, pai_t *fallback,
    const sec_opts_t *opts) {
	assert(opts->max_alloc >= PAGE);

	size_t max_alloc = PAGE_FLOOR(opts->max_alloc);
	pszind_t npsizes = sz_psz2ind(max_alloc) + 1;

	size_t sz_shards = opts->nshards * sizeof(sec_shard_t);
	size_t sz_bins = opts->nshards * (size_t)npsizes * sizeof(sec_bin_t);
	size_t sz_alloc = sz_shards + sz_bins;
	void *dynalloc = base_alloc(tsdn, base, sz_alloc, CACHELINE);
	if (dynalloc == NULL) {
		return true;
	}
	sec_shard_t *shard_cur = (sec_shard_t *)dynalloc;
	sec->shards = shard_cur;
	sec_bin_t *bin_cur = (sec_bin_t *)&shard_cur[opts->nshards];
	/* Just for asserts, below. */
	sec_bin_t *bin_start = bin_cur;

	for (size_t i = 0; i < opts->nshards; i++) {
		sec_shard_t *shard = shard_cur;
		shard_cur++;
		bool err = malloc_mutex_init(&shard->mtx, "sec_shard",
		    WITNESS_RANK_SEC_SHARD, malloc_mutex_rank_exclusive);
		if (err) {
			return true;
		}
		shard->enabled = true;
		shard->bins = bin_cur;
		for (pszind_t j = 0; j < npsizes; j++) {
			sec_bin_init(&shard->bins[j]);
			bin_cur++;
		}
		shard->bytes_cur = 0;
		shard->to_flush_next = 0;
	}
	/*
	 * Should have exactly matched the bin_start to the first unused byte
	 * after the shards.
	 */
	assert((void *)shard_cur == (void *)bin_start);
	/* And the last bin to use up the last bytes of the allocation. */
	assert((char *)bin_cur == ((char *)dynalloc + sz_alloc));
	sec->fallback = fallback;


	sec->opts = *opts;
	sec->npsizes = npsizes;

	/*
	 * Initialize these last so that an improper use of an SEC whose
	 * initialization failed will segfault in an easy-to-spot way.
	 */
	sec->pai.alloc = &sec_alloc;
	sec->pai.alloc_batch = &pai_alloc_batch_default;
	sec->pai.expand = &sec_expand;
	sec->pai.shrink = &sec_shrink;
	sec->pai.dalloc = &sec_dalloc;
	sec->pai.dalloc_batch = &pai_dalloc_batch_default;

	return false;
}